

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getModuleDeclarationKind(TokenKind kind)

{
  SyntaxKind SVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 200) {
    return InterfaceDeclaration;
  }
  SVar1 = ModuleDeclaration;
  if ((iVar2 != 0xd5) && (iVar2 != 0xd9)) {
    if (iVar2 == 0xe8) {
      return PackageDeclaration;
    }
    if (iVar2 == 0xef) {
      return ProgramDeclaration;
    }
    SVar1 = Unknown;
  }
  return SVar1;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleDeclarationKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramDeclaration;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceDeclaration;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageDeclaration;
        default: return SyntaxKind::Unknown;
    }
}